

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O2

Formula * __thiscall
FMB::FiniteModelMultiSorted::partialEvaluate(FiniteModelMultiSorted *this,Formula *formula)

{
  Term *this_00;
  bool bVar1;
  _Alloc_hider _Var2;
  Formula *pFVar3;
  NegatedFormula *this_01;
  Formula *pFVar4;
  UserErrorException *this_02;
  undefined8 *puVar5;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_01 = (NegatedFormula *)formula;
  switch(formula->_connective) {
  case LITERAL:
    this_00 = *(Term **)(formula + 1);
    bVar1 = Kernel::Term::ground(this_00);
    if (bVar1) {
      bVar1 = evaluateGroundLiteral(this,(Literal *)this_00);
      if (bVar1) {
        pFVar4 = Kernel::Formula::trueFormula();
        return pFVar4;
      }
      pFVar4 = Kernel::Formula::falseFormula();
      return pFVar4;
    }
    break;
  case AND:
  case OR:
    puVar5 = *(undefined8 **)(formula + 1);
    pFVar4 = (Formula *)0x0;
    while (puVar5 != (undefined8 *)0x0) {
      pFVar3 = (Formula *)*puVar5;
      puVar5 = (undefined8 *)puVar5[1];
      pFVar3 = partialEvaluate(this,pFVar3);
      pFVar4 = (Formula *)
               Lib::List<Kernel::Formula_*>::cons(pFVar3,(List<Kernel::Formula_*> *)pFVar4);
    }
    this_01 = (NegatedFormula *)Kernel::JunctionFormula::operator_new(0x30);
    Kernel::Formula::Formula((Formula *)this_01,formula->_connective);
    this_01->_arg = pFVar4;
    break;
  case IMP:
  case IFF:
  case XOR:
    pFVar4 = (Formula *)formula[1]._label._M_dataplus._M_p;
    pFVar3 = partialEvaluate(this,*(Formula **)(formula + 1));
    _Var2._M_p = (pointer)partialEvaluate(this,pFVar4);
    this_01 = (NegatedFormula *)Kernel::BinaryFormula::operator_new(0x38);
    Kernel::Formula::Formula((Formula *)this_01,formula->_connective);
    this_01->_arg = pFVar3;
    *(pointer *)&this_01[1].super_Formula = _Var2._M_p;
    break;
  case NOT:
    pFVar4 = partialEvaluate(this,*(Formula **)(formula + 1));
    this_01 = (NegatedFormula *)Kernel::NegatedFormula::operator_new(0x30);
    Kernel::NegatedFormula::NegatedFormula(this_01,pFVar4);
    break;
  case FORALL:
  case EXISTS:
    pFVar4 = *(Formula **)(formula + 1);
    pFVar3 = partialEvaluate(this,(Formula *)formula[1]._label._M_string_length);
    this_01 = (NegatedFormula *)Kernel::QuantifiedFormula::operator_new(0x40);
    Kernel::Formula::Formula((Formula *)this_01,formula->_connective);
    this_01->_arg = pFVar4;
    *(pointer *)&this_01[1].super_Formula = (pointer)0x0;
    this_01[1].super_Formula._label._M_dataplus._M_p = (pointer)pFVar3;
    break;
  default:
    this_02 = (UserErrorException *)__cxa_allocate_exception(0x50);
    Kernel::Formula::toString_abi_cxx11_(&local_80,formula);
    std::operator+(&local_60,"Cannot evaluate ",&local_80);
    std::operator+(&local_40,&local_60,", not supported");
    Lib::UserErrorException::Exception(this_02,&local_40);
    __cxa_throw(this_02,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  case FALSE:
  case TRUE:
    break;
  }
  return &this_01->super_Formula;
}

Assistant:

Formula* FiniteModelMultiSorted::partialEvaluate(Formula* formula)
    {
#if DEBUG_MODEL
        for(unsigned i=0;i<depth;i++){ cout << "."; }
        cout << "Evaluating..." << formula->toString() << endl;
#endif
        
        switch(formula->connective()){
                case LITERAL:
            {
                Literal* lit = formula->literal();
                if(!lit->ground()){
                    return formula;
                }
                bool evaluated = evaluateGroundLiteral(lit);
                return evaluated ? Formula::trueFormula() : Formula::falseFormula(); 
            }
                
                case FALSE:
                case TRUE:
                    return formula;
                case NOT:
                {
                  Formula* inner = partialEvaluate(formula->uarg());
                  return new NegatedFormula(inner);
                }
                case AND:
                case OR:
            {
                FormulaList* args = formula->args();
                FormulaList* newArgs = 0;
                FormulaList::Iterator fit(args);
                while(fit.hasNext()){
                    Formula* newArg = partialEvaluate(fit.next());
                    FormulaList::push(newArg,newArgs);
                }
                return new JunctionFormula(formula->connective(),newArgs); 
            }
                
                case IMP:
                case XOR:
                case IFF:
            {
                Formula* left = formula->left();
                Formula* right = formula->right();
                Formula* newLeft = partialEvaluate(left);
                Formula* newRight = partialEvaluate(right);
                
                return new BinaryFormula(formula->connective(),newLeft,newRight); 
            }
                
                case FORALL:
                case EXISTS:
            {
                VList* vs = formula->vars();
                Formula* inner  = formula->qarg();
                Formula* newInner = partialEvaluate(inner);
                return new QuantifiedFormula(formula->connective(),vs,0,newInner);
            }
            default:
                USER_ERROR("Cannot evaluate " + formula->toString() + ", not supported");
        }

        NOT_IMPLEMENTED;
        return 0;
    }